

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
CheckEqualFailure::CheckEqualFailure
          (CheckEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *expected,SimpleString *actual,SimpleString *text)

{
  int iVar1;
  SimpleString *actual_00;
  SimpleString *this_00;
  SimpleString *in_RDI;
  size_t failStart;
  TestFailure *in_stack_00000098;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  SimpleString *in_stack_ffffffffffffff70;
  TestFailure *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffffa8;
  long lVar2;
  SimpleString *in_stack_ffffffffffffffb0;
  TestFailure *in_stack_ffffffffffffffb8;
  TestFailure *in_stack_ffffffffffffffc0;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffffc0,(UtestShell *)in_stack_ffffffffffffffb8,
             (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI->buffer_ = (char *)&PTR__CheckEqualFailure_001ca8e0;
  TestFailure::createUserText(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  SimpleString::operator=
            (in_stack_ffffffffffffff70,
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  SimpleString::~SimpleString((SimpleString *)0x17edbf);
  lVar2 = 0;
  while( true ) {
    actual_00 = (SimpleString *)SimpleString::asCharString((SimpleString *)0x17edd2);
    iVar1 = (int)*(char *)((long)&actual_00->buffer_ + lVar2);
    this_00 = (SimpleString *)SimpleString::asCharString((SimpleString *)0x17edf5);
    if (iVar1 != *(char *)((long)&this_00->buffer_ + lVar2)) break;
    lVar2 = lVar2 + 1;
  }
  TestFailure::createButWasString(in_stack_ffffffffffffff88,in_RDI,actual_00);
  SimpleString::operator+=(this_00,(SimpleString *)CONCAT44(iVar1,in_stack_ffffffffffffff68));
  SimpleString::~SimpleString((SimpleString *)0x17ee8e);
  TestFailure::createDifferenceAtPosString
            (in_stack_00000098,(SimpleString *)this,(size_t)test,fileName._4_4_);
  SimpleString::operator+=(this_00,(SimpleString *)CONCAT44(iVar1,in_stack_ffffffffffffff68));
  SimpleString::~SimpleString((SimpleString *)0x17eecb);
  return;
}

Assistant:

CheckEqualFailure::CheckEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const SimpleString& expected, const SimpleString& actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    size_t failStart;
    for (failStart = 0; actual.asCharString()[failStart] == expected.asCharString()[failStart]; failStart++)
        ;
    message_ += createButWasString(expected, actual);
    message_ += createDifferenceAtPosString(actual, failStart);

}